

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O3

shared_ptr<gui::Slider> __thiscall gui::Slider::create(Slider *this,Theme *theme,String *name)

{
  Slider *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::Slider> sVar1;
  locale alStack_68 [8];
  shared_ptr<gui::SliderStyle> local_60;
  String local_50;
  
  this_00 = (Slider *)operator_new(0x260);
  std::locale::locale(alStack_68);
  sf::String::String(&local_50,"Slider",alStack_68);
  Theme::getStyle<gui::SliderStyle>((Theme *)&local_60,(String *)theme);
  Slider(this_00,&local_60,name);
  std::__shared_ptr<gui::Slider,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::Slider,void>
            ((__shared_ptr<gui::Slider,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  if ((Gui *)local_60.super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi != (Gui *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_50.m_string._M_dataplus._M_p != &local_50.m_string.field_2) {
    operator_delete(local_50.m_string._M_dataplus._M_p);
  }
  std::locale::~locale(alStack_68);
  sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::Slider>)sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Slider> Slider::create(const Theme& theme, const sf::String& name) {
    return std::shared_ptr<Slider>(new Slider(theme.getStyle<SliderStyle>("Slider"), name));
}